

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatecode.c
# Opt level: O1

void output_c_for_amode_ptr(Token *t,BOOL reversed)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  size_t __size;
  char *pcVar6;
  uint uVar7;
  char buf [512];
  char acStack_228 [512];
  
  bVar1 = (t->u).reginfo.which;
  uVar4 = bVar1 & 7;
  bVar2 = (t->u).reginfo.size;
  switch(bVar1 >> 3 & 7) {
  default:
    pcVar6 = "Internal error: called output_c_for_amode_ptr with a register addressing mode!";
    goto LAB_0010dc7d;
  case 2:
    fprintf((FILE *)syn68k_c_stream,"(ADDRESS_REGISTER_UL (%d)) ",(ulong)uVar4);
    return;
  case 3:
    fprintf((FILE *)syn68k_c_stream,"(ADDRESS_REGISTER_UL (%d)) ",(ulong)uVar4);
    if (uVar4 == 7 || bVar2 != 1) {
      uVar3 = 2;
      if (bVar2 != 1) {
        uVar3 = (ulong)bVar2;
      }
      if (uVar4 != 7) {
        uVar3 = (ulong)(uint)bVar2;
      }
      pcVar6 = "INC_VAR (ADDRESS_REGISTER_UL (%d), %d); ";
LAB_0010dce8:
      sprintf(acStack_228,pcVar6,(ulong)uVar4,uVar3);
      goto LAB_0010dcef;
    }
    pcVar6 = "++ADDRESS_REGISTER_UL (%d); ";
    break;
  case 4:
    uVar7 = (uint)bVar2;
    uVar5 = 2;
    if (uVar7 != 1) {
      uVar5 = uVar7;
    }
    uVar3 = (ulong)uVar5;
    if (uVar4 != 7) {
      uVar3 = (ulong)bVar2;
    }
    fprintf((FILE *)syn68k_c_stream,"(ADDRESS_REGISTER_UL (%d) - %d) ",(ulong)uVar4,uVar3);
    if (uVar4 == 7 || uVar7 != 1) {
      pcVar6 = "DEC_VAR (ADDRESS_REGISTER_UL (%d), %d); ";
      goto LAB_0010dce8;
    }
    pcVar6 = "--ADDRESS_REGISTER_UL (%d); ";
    break;
  case 5:
    pcVar6 = 
    "Internal error: attempting to generate code for fixed amode 5.  It should have been expanded and replaced with explicit code to compute the pointer.\n"
    ;
LAB_0010dc7d:
    fatal_error(pcVar6);
    return;
  case 6:
  case 7:
    if (reversed == FALSE) {
      pcVar6 = " (cpu_state.amode_p) ";
      __size = 0x15;
    }
    else {
      pcVar6 = " (cpu_state.reversed_amode_p) ";
      __size = 0x1e;
    }
    fwrite(pcVar6,__size,1,(FILE *)syn68k_c_stream);
    return;
  }
  sprintf(acStack_228,pcVar6,(ulong)uVar4);
LAB_0010dcef:
  pcVar6 = strstr(c_postamble,acStack_228);
  if (pcVar6 == (char *)0x0) {
    strcat(c_postamble,acStack_228);
  }
  return;
}

Assistant:

static void
output_c_for_amode_ptr (const Token *t, BOOL reversed)
{
  int reg = t->u.amodeinfo.which & 7, mode = (t->u.amodeinfo.which >> 3) & 7;
  char buf[512];
  int size = t->u.amodeinfo.size;

  switch (mode) {
  case 0:
  case 1:
    fatal_error ("Internal error: called output_c_for_amode_ptr with "
		 "a register addressing mode!");
    break;

  case 2:
    fprintf (syn68k_c_stream, "(ADDRESS_REGISTER_UL (%d)) ", reg);
    break;

  case 3:
    fprintf (syn68k_c_stream, "(ADDRESS_REGISTER_UL (%d)) ", reg);

    /* Perform postincrement, but force sp to remain even! */
    if (size == 1 && reg != 7)
      sprintf (buf, "++ADDRESS_REGISTER_UL (%d); ", reg);
    else
      sprintf (buf, "INC_VAR (ADDRESS_REGISTER_UL (%d), %d); ", reg,
	       (reg != 7 || size != 1) ? size : 2);
    if (strstr (c_postamble, buf) == NULL)
      strcat (c_postamble, buf);
    break;
  case 4:
    fprintf (syn68k_c_stream, "(ADDRESS_REGISTER_UL (%d) - %d) ", reg,
	     (reg != 7 || size != 1) ? size : 2);

    /* Perform predecrement, but force sp to remain even! */
    if (size == 1 && reg != 7)
      sprintf (buf, "--ADDRESS_REGISTER_UL (%d); ", reg);
    else
      sprintf (buf, "DEC_VAR (ADDRESS_REGISTER_UL (%d), %d); ", reg,
	       (reg != 7 || size != 1) ? size : 2);
    if (strstr (c_postamble, buf) == NULL)
      strcat (c_postamble, buf);
    break;
  case 5:
    fatal_error ("Internal error: attempting to generate code for fixed "
		 "amode 5.  It should have been expanded and replaced with "
		 "explicit code to compute the pointer.\n");
    break;

    /* Modes 6 and 7 are too complicated to expand; a pointer to the data
     * will be placed in the appropriate place by the synthetic instruction
     * right before this one.
     */
  case 6:
  case 7:
    if (!reversed)
      fprintf (syn68k_c_stream, " (cpu_state.amode_p) ");
    else
      fprintf (syn68k_c_stream, " (cpu_state.reversed_amode_p) ");
    break;
  }
}